

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

NestedCompositeComponents * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray
          (NestedCompositeComponents *__return_storage_ptr__,
          InterfaceVariableScalarReplacement *this,Instruction *interface_var_type,
          StorageClass storage_class,uint32_t extra_array_length)

{
  IRContext *this_00;
  DefUseManager *def_use_mgr;
  uint32_t uVar1;
  Instruction *interface_var_type_00;
  NestedCompositeComponents scalar_vars_for_element;
  NestedCompositeComponents local_50;
  
  if (interface_var_type->opcode_ == OpTypeArray) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    def_use_mgr = (this_00->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
    uVar1 = anon_unknown_0::GetArrayLength(def_use_mgr,interface_var_type);
    interface_var_type_00 = anon_unknown_0::GetArrayElementType(def_use_mgr,interface_var_type);
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->component_variable = (Instruction *)0x0;
    if (uVar1 != 0) {
      do {
        CreateScalarInterfaceVarsForReplacement
                  (&local_50,this,interface_var_type_00,storage_class,extra_array_length);
        std::
        vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
        ::push_back(&__return_storage_ptr__->nested_composite_components,&local_50);
        std::
        vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
        ::~vector(&local_50.nested_composite_components);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("interface_var_type->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x322,
                "InterfaceVariableScalarReplacement::NestedCompositeComponents spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(Instruction *, spv::StorageClass, uint32_t)"
               );
}

Assistant:

InterfaceVariableScalarReplacement::NestedCompositeComponents
InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(
    Instruction* interface_var_type, spv::StorageClass storage_class,
    uint32_t extra_array_length) {
  assert(interface_var_type->opcode() == spv::Op::OpTypeArray);

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t array_length = GetArrayLength(def_use_mgr, interface_var_type);
  Instruction* elem_type = GetArrayElementType(def_use_mgr, interface_var_type);

  NestedCompositeComponents scalar_vars;
  while (array_length > 0) {
    NestedCompositeComponents scalar_vars_for_element =
        CreateScalarInterfaceVarsForReplacement(elem_type, storage_class,
                                                extra_array_length);
    scalar_vars.AddComponent(scalar_vars_for_element);
    --array_length;
  }
  return scalar_vars;
}